

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hardsigmoid_x86_fma.cpp
# Opt level: O2

int __thiscall
ncnn::HardSigmoid_x86_fma::forward_inplace
          (HardSigmoid_x86_fma *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  void *pvVar2;
  size_t sVar3;
  size_t sVar4;
  _func_int **pp_Var5;
  _func_int *p_Var6;
  int iVar7;
  ulong uVar8;
  ulong uVar9;
  undefined1 (*pauVar10) [32];
  long lVar11;
  long lVar12;
  int iVar13;
  undefined1 auVar14 [32];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar19 [16];
  undefined4 uVar18;
  undefined1 auVar20 [32];
  
  iVar7 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->d * bottom_top_blob->elempack;
  uVar9 = 0;
  uVar8 = (ulong)(uint)bottom_top_blob->c;
  if (bottom_top_blob->c < 1) {
    uVar8 = uVar9;
  }
  auVar14._8_4_ = 0x3f800000;
  auVar14._0_8_ = 0x3f8000003f800000;
  auVar14._12_4_ = 0x3f800000;
  auVar14._16_4_ = 0x3f800000;
  auVar14._20_4_ = 0x3f800000;
  auVar14._24_4_ = 0x3f800000;
  auVar14._28_4_ = 0x3f800000;
  auVar15._8_4_ = 0x3f800000;
  auVar15._0_8_ = 0x3f8000003f800000;
  auVar15._12_4_ = 0x3f800000;
  for (; uVar9 != uVar8; uVar9 = uVar9 + 1) {
    pvVar2 = bottom_top_blob->data;
    sVar3 = bottom_top_blob->elemsize;
    sVar4 = bottom_top_blob->cstep;
    pauVar10 = (undefined1 (*) [32])(sVar4 * uVar9 * sVar3 + (long)pvVar2);
    pp_Var5 = this->_vptr_HardSigmoid_x86_fma;
    lVar11 = 0;
    for (iVar13 = 0; iVar13 + 7 < iVar7; iVar13 = iVar13 + 8) {
      uVar18 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var5[-3]);
      auVar17._4_4_ = uVar18;
      auVar17._0_4_ = uVar18;
      auVar17._8_4_ = uVar18;
      auVar17._12_4_ = uVar18;
      auVar17._16_4_ = uVar18;
      auVar17._20_4_ = uVar18;
      auVar17._24_4_ = uVar18;
      auVar17._28_4_ = uVar18;
      uVar18 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var5[-3]);
      auVar20._4_4_ = uVar18;
      auVar20._0_4_ = uVar18;
      auVar20._8_4_ = uVar18;
      auVar20._12_4_ = uVar18;
      auVar20._16_4_ = uVar18;
      auVar20._20_4_ = uVar18;
      auVar20._24_4_ = uVar18;
      auVar20._28_4_ = uVar18;
      auVar16 = vfmadd132ps_fma(auVar20,auVar17,*pauVar10);
      auVar17 = vmaxps_avx(ZEXT1632(auVar16),ZEXT1632(ZEXT816(0) << 0x40));
      auVar17 = vminps_avx(auVar17,auVar14);
      *pauVar10 = auVar17;
      pauVar10 = pauVar10 + 1;
      lVar11 = lVar11 + 8;
    }
    pp_Var5 = this->_vptr_HardSigmoid_x86_fma;
    for (; iVar13 + 3 < iVar7; iVar13 = iVar13 + 4) {
      uVar18 = *(undefined4 *)(&this->field_0xd4 + (long)pp_Var5[-3]);
      auVar16._4_4_ = uVar18;
      auVar16._0_4_ = uVar18;
      auVar16._8_4_ = uVar18;
      auVar16._12_4_ = uVar18;
      uVar18 = *(undefined4 *)(&this->field_0xd0 + (long)pp_Var5[-3]);
      auVar19._4_4_ = uVar18;
      auVar19._0_4_ = uVar18;
      auVar19._8_4_ = uVar18;
      auVar19._12_4_ = uVar18;
      auVar16 = vfmadd132ps_fma(auVar19,auVar16,*(undefined1 (*) [16])*pauVar10);
      auVar16 = vmaxps_avx(auVar16,ZEXT816(0) << 0x40);
      auVar16 = vminps_avx(auVar16,auVar15);
      *(undefined1 (*) [16])*pauVar10 = auVar16;
      pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
      lVar11 = lVar11 + 4;
    }
    pp_Var5 = this->_vptr_HardSigmoid_x86_fma;
    lVar12 = sVar4 * sVar3 * uVar9;
    for (; (int)lVar11 < iVar7; lVar11 = lVar11 + 1) {
      fVar1 = *(float *)((long)pvVar2 + lVar11 * 4 + lVar12);
      p_Var6 = pp_Var5[-3];
      uVar18 = 0;
      if ((*(float *)(&this->field_0xd8 + (long)p_Var6) <= fVar1) &&
         (uVar18 = 0x3f800000, fVar1 <= *(float *)(&this->field_0xdc + (long)p_Var6))) {
        auVar16 = vfmadd213ss_fma(ZEXT416((uint)fVar1),
                                  ZEXT416(*(uint *)(&this->field_0xd0 + (long)p_Var6)),
                                  ZEXT416(*(uint *)(&this->field_0xd4 + (long)p_Var6)));
        uVar18 = auVar16._0_4_;
      }
      *(undefined4 *)((long)pvVar2 + lVar11 * 4 + lVar12) = uVar18;
    }
  }
  return 0;
}

Assistant:

int HardSigmoid_x86_fma::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int d = bottom_top_blob.d;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * d * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _zero_avx512 = _mm512_setzero_ps();
        __m512 _one_avx512 = _mm512_set1_ps(1.f);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _ans = _mm512_set1_ps(beta);
            _ans = _mm512_fmadd_ps(_p, _mm512_set1_ps(alpha), _ans);
            _ans = _mm512_max_ps(_ans, _zero_avx512);
            _ans = _mm512_min_ps(_ans, _one_avx512);
            _mm512_storeu_ps(ptr, _ans);
            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _zero_avx = _mm256_setzero_ps();
        __m256 _one_avx = _mm256_set1_ps(1.f);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _ans = _mm256_set1_ps(beta);
            _ans = _mm256_comp_fmadd_ps(_p, _mm256_set1_ps(alpha), _ans);
            _ans = _mm256_max_ps(_ans, _zero_avx);
            _ans = _mm256_min_ps(_ans, _one_avx);
            _mm256_storeu_ps(ptr, _ans);
            ptr += 8;
        }
#endif // __AVX__
        __m128 _zero = _mm_setzero_ps();
        __m128 _one = _mm_set1_ps(1.f);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _ans = _mm_set1_ps(beta);
            _ans = _mm_add_ps(_mm_mul_ps(_p, _mm_set1_ps(alpha)), _ans);
            _ans = _mm_max_ps(_ans, _zero);
            _ans = _mm_min_ps(_ans, _one);
            _mm_store_ps(ptr, _ans);
            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < lower)
                *ptr = 0.f;
            else if (*ptr > upper)
                *ptr = 1.f;
            else
                *ptr = *ptr * alpha + beta;
            ptr++;
        }
    }

    return 0;
}